

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,StuntDouble *sd,SelectionSet *bs,int property,int comparator,
          float comparisonValue,int frame)

{
  RealType RVar1;
  bool bVar2;
  int iVar3;
  SnapshotManager *pSVar4;
  double *pdVar5;
  reference this_00;
  int in_ECX;
  Atom *atom_00;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RDX;
  StuntDouble *in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  float in_XMM0_Da;
  bool match;
  Atom *atom_2;
  AtomIterator ai;
  RigidBody *rb;
  Atom *atom_1;
  Atom *atom;
  Vector3d pos;
  RealType propertyValue;
  Vector3<double> *in_stack_fffffffffffffeb8;
  Vector3<double> *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  int in_stack_fffffffffffffefc;
  SelectionEvaluator *in_stack_ffffffffffffff00;
  Vector3d *in_stack_ffffffffffffff38;
  Snapshot *in_stack_ffffffffffffff40;
  Vector3<double> local_b8;
  Vector3<double> local_a0;
  Vector3<double> local_88;
  Atom *local_70;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_68;
  StuntDouble *local_60;
  StuntDouble *local_58;
  StuntDouble *local_50;
  Vector3<double> local_48;
  double local_30;
  uint local_28;
  float local_24;
  int local_20;
  int local_1c;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *local_18;
  StuntDouble *local_10;
  
  local_30 = 0.0;
  local_28 = in_R9D;
  local_24 = in_XMM0_Da;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  Vector3<double>::Vector3((Vector3<double> *)0x3ccd45);
  atom_00 = (Atom *)(ulong)(local_1c - 0x1c00);
  iVar3 = (int)((ulong)in_RDI >> 0x20);
  switch(atom_00) {
  case (Atom *)0x0:
    local_30 = StuntDouble::getMass(local_10);
    break;
  case (Atom *)0x1:
    bVar2 = StuntDouble::isAtom(local_10);
    if (bVar2) {
      local_58 = local_10;
      local_30 = getCharge((SelectionEvaluator *)
                           CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),atom_00,
                           (int)((ulong)in_RDI >> 0x20));
    }
    else {
      bVar2 = StuntDouble::isRigidBody(local_10);
      if (bVar2) {
        local_60 = local_10;
        __gnu_cxx::
        __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
        ::__normal_iterator(&local_68);
        local_70 = RigidBody::beginAtom
                             ((RigidBody *)
                              CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                              (iterator *)atom_00);
        while (local_70 != (Atom *)0x0) {
          RVar1 = getCharge((SelectionEvaluator *)
                            CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),atom_00,
                            (int)((ulong)in_RDI >> 0x20));
          local_30 = RVar1 + local_30;
          local_70 = RigidBody::nextAtom((RigidBody *)
                                         CONCAT17(in_stack_fffffffffffffee7,
                                                  in_stack_fffffffffffffee0),(iterator *)atom_00);
        }
      }
    }
    break;
  case (Atom *)0x2:
    StuntDouble::getPos((StuntDouble *)atom_00,iVar3);
    pdVar5 = Vector3<double>::x(&local_88);
    local_30 = *pdVar5;
    break;
  case (Atom *)0x3:
    StuntDouble::getPos((StuntDouble *)atom_00,iVar3);
    pdVar5 = Vector3<double>::y(&local_a0);
    local_30 = *pdVar5;
    break;
  case (Atom *)0x4:
    StuntDouble::getPos((StuntDouble *)atom_00,iVar3);
    pdVar5 = Vector3<double>::z(&local_b8);
    local_30 = *pdVar5;
    break;
  case (Atom *)0x5:
    StuntDouble::getPos((StuntDouble *)atom_00,iVar3);
    local_30 = Vector<double,_3U>::length((Vector<double,_3U> *)0x3cd10d);
    break;
  case (Atom *)0x6:
    StuntDouble::getPos((StuntDouble *)atom_00,iVar3);
    Vector3<double>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    pSVar4 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x208));
    (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,(ulong)local_28);
    Snapshot::wrapVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    pdVar5 = Vector3<double>::x(&local_48);
    local_30 = *pdVar5;
    break;
  case (Atom *)0x7:
    StuntDouble::getPos((StuntDouble *)atom_00,iVar3);
    Vector3<double>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    pSVar4 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x208));
    (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,(ulong)local_28);
    Snapshot::wrapVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    pdVar5 = Vector3<double>::y(&local_48);
    local_30 = *pdVar5;
    break;
  case (Atom *)0x8:
    StuntDouble::getPos((StuntDouble *)atom_00,iVar3);
    Vector3<double>::operator=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    pSVar4 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x208));
    (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,(ulong)local_28);
    Snapshot::wrapVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    pdVar5 = Vector3<double>::z(&local_48);
    local_30 = *pdVar5;
    break;
  case (Atom *)0x9:
    bVar2 = StuntDouble::isAtom(local_10);
    if (bVar2) {
      local_50 = local_10;
      iVar3 = StuntDouble::getGlobalIndex(local_10);
      local_30 = (double)iVar3;
    }
    break;
  default:
    unrecognizedAtomProperty(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  bVar2 = false;
  if (local_20 - 0x3400U < 5 || local_20 == 0x3405) {
    switch((long)&switchD_003cd15d::switchdataD_0043745c +
           (long)(int)(&switchD_003cd15d::switchdataD_0043745c)[local_20 - 0x3400U]) {
    case 0x3cd15f:
      bVar2 = local_30 < (double)local_24;
      break;
    case 0x3cd187:
      bVar2 = local_30 <= (double)local_24;
      break;
    case 0x3cd1af:
      bVar2 = (double)local_24 <= local_30;
      break;
    case 0x3cd1d7:
      bVar2 = (double)local_24 < local_30;
      break;
    case 0x3cd1fc:
      bVar2 = ABS(local_30 - (double)local_24) <= 1e-06;
      break;
    case 0x3cd238:
      bVar2 = local_30 != (double)local_24;
    }
  }
  if (bVar2) {
    this_00 = std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                        (local_18,0);
    StuntDouble::getGlobalIndex(local_10);
    OpenMDBitSet::setBitOn(this_00,(size_t)in_stack_fffffffffffffeb8);
  }
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(StuntDouble* sd, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue, int frame) {
    RealType propertyValue = 0.0;
    Vector3d pos;
    switch (property) {
    case Token::atomno:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = atom->getGlobalIndex();
      }
      break;
    case Token::mass:
      propertyValue = sd->getMass();
      break;
    case Token::charge:
      if (sd->isAtom()) {
        Atom* atom    = static_cast<Atom*>(sd);
        propertyValue = getCharge(atom, frame);
      } else if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        RigidBody::AtomIterator ai;
        Atom* atom;
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          propertyValue += getCharge(atom, frame);
        }
      }
      break;
    case Token::x:
      propertyValue = sd->getPos(frame).x();
      break;
    case Token::y:
      propertyValue = sd->getPos(frame).y();
      break;
    case Token::z:
      propertyValue = sd->getPos(frame).z();
      break;
    case Token::wrappedX:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = sd->getPos(frame);
      info->getSnapshotManager()->getSnapshot(frame)->wrapVector(pos);
      propertyValue = pos.z();
      break;

    case Token::r:
      propertyValue = sd->getPos(frame).length();
      break;
    default:
      unrecognizedAtomProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }
    if (match) bs.bitsets_[STUNTDOUBLE].setBitOn(sd->getGlobalIndex());
  }